

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

void __thiscall cmCTestMemCheckHandler::cmCTestMemCheckHandler(cmCTestMemCheckHandler *this)

{
  cmCTestMemCheckHandler *this_local;
  
  cmCTestTestHandler::cmCTestTestHandler(&this->super_cmCTestTestHandler);
  (this->super_cmCTestTestHandler).super_cmCTestGenericHandler._vptr_cmCTestGenericHandler =
       (_func_int **)&PTR_PopulateCustomVectors_01100900;
  std::__cxx11::string::string((string *)&this->BoundsCheckerDPBDFile);
  std::__cxx11::string::string((string *)&this->BoundsCheckerXMLFile);
  std::__cxx11::string::string((string *)&this->MemoryTester);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->MemoryTesterDynamicOptions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->MemoryTesterOptions);
  std::__cxx11::string::string((string *)&this->MemoryTesterOutputFile);
  std::__cxx11::string::string((string *)&this->MemoryTesterEnvironmentVariable);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ResultStrings);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ResultStringsLong);
  std::vector<int,_std::allocator<int>_>::vector(&this->GlobalResults);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->CustomPreMemCheck);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->CustomPostMemCheck);
  (this->super_cmCTestTestHandler).MemCheck = true;
  (this->super_cmCTestTestHandler).CustomMaximumPassedTestOutputSize = 0;
  (this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize = 0;
  this->LogWithPID = false;
  return;
}

Assistant:

cmCTestMemCheckHandler::cmCTestMemCheckHandler()
{
  this->MemCheck = true;
  this->CustomMaximumPassedTestOutputSize = 0;
  this->CustomMaximumFailedTestOutputSize = 0;
  this->LogWithPID = false;
}